

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

LineParametersWithConfidence *
deqp::gles3::Performance::anon_unknown_1::
fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
          (LineParametersWithConfidence *__return_storage_ptr__,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
          *samples,int beginNdx,int endNdx,int step,
          offset_in_MapBufferRangeDuration_to_deUint64 target)

{
  pointer pUVar1;
  LineParametersWithConfidence *pLVar2;
  LineParametersWithConfidence *extraout_RAX;
  Vec2 point;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> samplePoints;
  value_type local_60;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_58;
  LineParametersWithConfidence *local_38;
  
  local_58.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = __return_storage_ptr__;
  if (beginNdx < endNdx) {
    do {
      pUVar1 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_60.m_data[1] = (float)*(ulong *)((long)&pUVar1[beginNdx].duration.mapDuration + target);
      local_60.m_data[0] = (float)pUVar1[beginNdx].writtenSize;
      std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                (&local_58,&local_60);
      beginNdx = beginNdx + step;
    } while (beginNdx < endNdx);
  }
  pLVar2 = deqp::gls::theilSenSiegelLinearRegression(local_38,&local_58,0.6);
  if (local_58.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    pLVar2 = extraout_RAX;
  }
  return pLVar2;
}

Assistant:

static LineParametersWithConfidence fitLineToSamples (const std::vector<UploadSampleResult<DurationType> >& samples, int beginNdx, int endNdx, int step, deUint64 DurationType::*target = &DurationType::fitResponseDuration)
{
	std::vector<tcu::Vec2> samplePoints;

	for (int sampleNdx = beginNdx; sampleNdx < endNdx; sampleNdx += step)
	{
		tcu::Vec2 point;

		point.x() = (float)(samples[sampleNdx].writtenSize);
		point.y() = (float)(samples[sampleNdx].duration.*target);

		samplePoints.push_back(point);
	}

	return theilSenSiegelLinearRegression(samplePoints, 0.6f);
}